

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fare_attributes.c
# Opt level: O2

payment_method_t parse_payment_method(char *value)

{
  payment_method_t pVar1;
  payment_method_t pVar2;
  
  if (*value == '0') {
    pVar2 = PM_ON_BOARD;
  }
  else {
    if (*value != '1') {
      return PM_NOT_SET;
    }
    pVar2 = PM_BEFOREHAND;
  }
  pVar1 = PM_NOT_SET;
  if (value[1] == '\0') {
    pVar1 = pVar2;
  }
  return pVar1;
}

Assistant:

payment_method_t parse_payment_method(const char *value) {
    if (strcmp(value, "0") == 0)
        return PM_ON_BOARD;
    else if (strcmp(value, "1") == 0)
        return PM_BEFOREHAND;
    else
        return PM_NOT_SET;
}